

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

bool __thiscall
perfetto::protos::gen::AndroidLogConfig::ParseFromArray
          (AndroidLogConfig *this,void *raw,size_t size)

{
  byte bVar1;
  pointer pAVar2;
  iterator __position;
  bool bVar3;
  short sVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong *puVar10;
  AndroidLogId *pAVar11;
  uint8_t cur_byte_3;
  AndroidLogId AVar12;
  uint8_t cur_byte_2;
  ulong *puVar13;
  uint8_t cur_byte;
  ulong uVar14;
  uint8_t cur_byte_1;
  ulong *puVar15;
  Field local_48;
  vector<perfetto::protos::gen::AndroidLogId,_std::allocator<perfetto::protos::gen::AndroidLogId>_>
  *local_38;
  
  pAVar2 = (this->log_ids_).
           super__Vector_base<perfetto::protos::gen::AndroidLogId,_std::allocator<perfetto::protos::gen::AndroidLogId>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->log_ids_).
      super__Vector_base<perfetto::protos::gen::AndroidLogId,_std::allocator<perfetto::protos::gen::AndroidLogId>_>
      ._M_impl.super__Vector_impl_data._M_finish != pAVar2) {
    (this->log_ids_).
    super__Vector_base<perfetto::protos::gen::AndroidLogId,_std::allocator<perfetto::protos::gen::AndroidLogId>_>
    ._M_impl.super__Vector_impl_data._M_finish = pAVar2;
  }
  local_38 = &this->log_ids_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&this->filter_tags_,
                    (this->filter_tags_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  (this->unknown_fields_)._M_string_length = 0;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  puVar10 = (ulong *)(size + (long)raw);
  do {
    if (puVar10 <= raw) goto switchD_0022f174_caseD_3;
    bVar1 = (byte)*raw;
    uVar9 = (ulong)bVar1;
    puVar13 = (ulong *)((long)raw + 1);
    if ((char)bVar1 < '\0') {
      uVar9 = (ulong)(bVar1 & 0x7f);
      lVar7 = 7;
      do {
        if ((puVar10 <= puVar13) || (0x38 < lVar7 - 7U)) goto switchD_0022f174_caseD_3;
        uVar6 = *puVar13;
        puVar13 = (ulong *)((long)puVar13 + 1);
        uVar9 = uVar9 | (ulong)((byte)uVar6 & 0x7f) << ((byte)lVar7 & 0x3f);
        lVar7 = lVar7 + 7;
      } while ((char)(byte)uVar6 < '\0');
    }
    uVar6 = uVar9 >> 3;
    if (((uint)uVar6 == 0) || (puVar10 <= puVar13)) goto switchD_0022f174_caseD_3;
    switch((uint)uVar9 & 7) {
    case 0:
      uVar8 = 0;
      uVar14 = 0;
      while( true ) {
        puVar15 = (ulong *)((long)puVar13 + 1);
        uVar8 = (ulong)((byte)*puVar13 & 0x7f) << ((byte)uVar14 & 0x3f) | uVar8;
        if (-1 < (char)(byte)*puVar13) break;
        if ((puVar10 <= puVar15) ||
           (bVar3 = 0x38 < uVar14, uVar14 = uVar14 + 7, puVar13 = puVar15, bVar3))
        goto switchD_0022f174_caseD_3;
      }
      local_48.int_value_ = uVar8 & 0xffffffff00000000;
      break;
    case 1:
      puVar15 = puVar13 + 1;
      if (puVar10 < puVar15) goto switchD_0022f174_caseD_3;
      uVar8 = *puVar13;
      local_48.int_value_ = uVar8 & 0xffffffff00000000;
      break;
    case 2:
      puVar13 = (ulong *)((long)puVar13 + 1);
      uVar14 = 0;
      uVar8 = 0;
      puVar15 = puVar13;
      while (uVar14 = (ulong)(*(byte *)((long)puVar15 + -1) & 0x7f) << ((byte)uVar8 & 0x3f) | uVar14
            , (char)*(byte *)((long)puVar15 + -1) < '\0') {
        if (puVar10 <= puVar15) goto switchD_0022f174_caseD_3;
        puVar15 = (ulong *)((long)puVar15 + 1);
        puVar13 = (ulong *)((long)puVar13 + 1);
        bVar3 = 0x38 < uVar8;
        uVar8 = uVar8 + 7;
        if (bVar3) goto switchD_0022f174_caseD_3;
      }
      if (uVar14 <= (ulong)((long)puVar10 - (long)puVar13)) {
        local_48.int_value_ = (ulong)puVar13 & 0xffffffff00000000;
        puVar15 = (ulong *)((long)puVar15 + uVar14);
        uVar8 = (ulong)puVar13 & 0xffffffff;
        goto LAB_0022f251;
      }
    default:
      goto switchD_0022f174_caseD_3;
    case 5:
      puVar15 = (ulong *)((long)puVar13 + 4);
      if (puVar10 < puVar15) goto switchD_0022f174_caseD_3;
      uVar8 = (ulong)(uint)*puVar13;
      local_48.int_value_ = 0;
    }
    uVar14 = 0;
LAB_0022f251:
    raw = puVar15;
  } while ((0xffff < (uint)uVar6) || (0xfffffff < uVar14));
  local_48.int_value_ = local_48.int_value_ | uVar8 & 0xffffffff;
  uVar8 = uVar6 << 0x20 | uVar14;
  local_48.type_ = (byte)(uVar8 >> 0x30) | (byte)uVar9 & 7;
  local_48.size_ = (uint32_t)uVar14;
  local_48.id_ = (uint16_t)(uVar8 >> 0x20);
  sVar4 = (short)uVar6;
  while (sVar4 != 0) {
    AVar12 = (AndroidLogId)local_48.int_value_;
    if ((ushort)uVar6 < 5) {
      (this->_has_field_).super__Base_bitset<1UL>._M_w =
           (this->_has_field_).super__Base_bitset<1UL>._M_w | 1L << ((byte)uVar6 & 0x3f);
    }
    if ((ushort)uVar6 == 4) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::emplace_back<>(&this->filter_tags_);
      protozero::Field::get
                (&local_48,
                 (this->filter_tags_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1);
    }
    else {
      uVar5 = (uint)uVar6 & 0xffff;
      if (uVar5 == 3) {
        this->min_prio_ = AVar12;
      }
      else if (uVar5 == 1) {
        __position._M_current =
             (this->log_ids_).
             super__Vector_base<perfetto::protos::gen::AndroidLogId,_std::allocator<perfetto::protos::gen::AndroidLogId>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->log_ids_).
            super__Vector_base<perfetto::protos::gen::AndroidLogId,_std::allocator<perfetto::protos::gen::AndroidLogId>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<perfetto::protos::gen::AndroidLogId,_std::allocator<perfetto::protos::gen::AndroidLogId>_>
          ::_M_realloc_insert<>(local_38,__position);
          pAVar11 = (this->log_ids_).
                    super__Vector_base<perfetto::protos::gen::AndroidLogId,_std::allocator<perfetto::protos::gen::AndroidLogId>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          AVar12 = (AndroidLogId)local_48.int_value_;
        }
        else {
          *__position._M_current = LID_DEFAULT;
          pAVar11 = __position._M_current + 1;
          (this->log_ids_).
          super__Vector_base<perfetto::protos::gen::AndroidLogId,_std::allocator<perfetto::protos::gen::AndroidLogId>_>
          ._M_impl.super__Vector_impl_data._M_finish = pAVar11;
        }
        pAVar11[-1] = AVar12;
      }
      else {
        protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>
                  (&local_48,&this->unknown_fields_);
      }
    }
    do {
      if (puVar10 <= raw) goto switchD_0022f174_caseD_3;
      bVar1 = (byte)*raw;
      uVar9 = (ulong)(uint)bVar1;
      puVar13 = (ulong *)((long)raw + 1);
      if ((char)bVar1 < '\0') {
        uVar9 = (ulong)(bVar1 & 0x7f);
        lVar7 = 7;
        do {
          if ((puVar10 <= puVar13) || (0x38 < lVar7 - 7U)) goto switchD_0022f174_caseD_3;
          uVar6 = *puVar13;
          puVar13 = (ulong *)((long)puVar13 + 1);
          uVar9 = uVar9 | (ulong)((byte)uVar6 & 0x7f) << ((byte)lVar7 & 0x3f);
          lVar7 = lVar7 + 7;
        } while ((char)(byte)uVar6 < '\0');
      }
      uVar6 = uVar9 >> 3;
      if (((uint)uVar6 == 0) || (puVar10 <= puVar13)) goto switchD_0022f174_caseD_3;
      switch((uint)uVar9 & 7) {
      case 0:
        uVar8 = 0;
        uVar14 = 0;
        while( true ) {
          puVar15 = (ulong *)((long)puVar13 + 1);
          uVar8 = (ulong)((byte)*puVar13 & 0x7f) << ((byte)uVar14 & 0x3f) | uVar8;
          if (-1 < (char)(byte)*puVar13) break;
          if ((puVar10 <= puVar15) ||
             (bVar3 = 0x38 < uVar14, uVar14 = uVar14 + 7, puVar13 = puVar15, bVar3))
          goto switchD_0022f174_caseD_3;
        }
        local_48.int_value_ = uVar8 & 0xffffffff00000000;
        break;
      case 1:
        puVar15 = puVar13 + 1;
        if (puVar10 < puVar15) goto switchD_0022f174_caseD_3;
        uVar8 = *puVar13;
        local_48.int_value_ = uVar8 & 0xffffffff00000000;
        break;
      case 2:
        puVar13 = (ulong *)((long)puVar13 + 1);
        uVar14 = 0;
        uVar8 = 0;
        puVar15 = puVar13;
        while (uVar14 = (ulong)(*(byte *)((long)puVar15 + -1) & 0x7f) << ((byte)uVar8 & 0x3f) |
                        uVar14, (char)*(byte *)((long)puVar15 + -1) < '\0') {
          if (puVar10 <= puVar15) goto switchD_0022f174_caseD_3;
          puVar15 = (ulong *)((long)puVar15 + 1);
          puVar13 = (ulong *)((long)puVar13 + 1);
          bVar3 = 0x38 < uVar8;
          uVar8 = uVar8 + 7;
          if (bVar3) goto switchD_0022f174_caseD_3;
        }
        if (uVar14 <= (ulong)((long)puVar10 - (long)puVar13)) {
          local_48.int_value_ = (ulong)puVar13 & 0xffffffff00000000;
          puVar15 = (ulong *)((long)puVar15 + uVar14);
          uVar8 = (ulong)puVar13 & 0xffffffff;
          goto LAB_0022f526;
        }
      default:
        goto switchD_0022f174_caseD_3;
      case 5:
        puVar15 = (ulong *)((long)puVar13 + 4);
        if (puVar10 < puVar15) goto switchD_0022f174_caseD_3;
        uVar8 = (ulong)(uint)*puVar13;
        local_48.int_value_ = 0;
      }
      uVar14 = 0;
LAB_0022f526:
      raw = puVar15;
    } while ((0xffff < (uint)uVar6) || (0xfffffff < uVar14));
    local_48.int_value_ = local_48.int_value_ | uVar8 & 0xffffffff;
    uVar8 = uVar6 << 0x20 | uVar14;
    local_48.type_ = (byte)(uVar8 >> 0x30) | (byte)uVar9 & 7;
    local_48.size_ = (uint32_t)uVar14;
    local_48.id_ = (uint16_t)(uVar8 >> 0x20);
    sVar4 = (short)uVar6;
  }
switchD_0022f174_caseD_3:
  return puVar10 == (ulong *)raw;
}

Assistant:

bool AndroidLogConfig::ParseFromArray(const void* raw, size_t size) {
  log_ids_.clear();
  filter_tags_.clear();
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* log_ids */:
        log_ids_.emplace_back();
        field.get(&log_ids_.back());
        break;
      case 3 /* min_prio */:
        field.get(&min_prio_);
        break;
      case 4 /* filter_tags */:
        filter_tags_.emplace_back();
        field.get(&filter_tags_.back());
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}